

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_replacement_field
          (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
           *this,wchar_t *p)

{
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
  *this_00;
  iterator it;
  long in_RDI;
  basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_00000020;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> *in_stack_00000028;
  wchar_t *in_stack_ffffffffffffffb8;
  basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffffc0;
  format_specs *in_stack_ffffffffffffffc8;
  basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler> *in_stack_ffffffffffffffd0;
  context_type *in_stack_ffffffffffffffd8;
  arg_formatter<fmt::v6::buffer_range<wchar_t>_> *in_stack_ffffffffffffffe0;
  
  advance_to<wchar_t,fmt::v6::internal::error_handler>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = (basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>
             *)(in_RDI + 0x20);
  arg_formatter<fmt::v6::buffer_range<wchar_t>_>::arg_formatter
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  it = visit_format_arg<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                 (in_stack_00000028,in_stack_00000020);
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>::
  advance_to(this_00,(iterator)it.container);
  return;
}

Assistant:

void on_replacement_field(const Char* p) {
    advance_to(parse_context, p);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context), arg));
  }